

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

char * stbi__hdr_gettoken(stbi__context *z,char *buffer)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  int iVar3;
  stbi_uc *psVar4;
  stbi_uc *psVar5;
  stbi_uc sVar6;
  long lVar7;
  bool bVar8;
  
  psVar5 = z->img_buffer;
  psVar4 = z->img_buffer_end;
  if (psVar5 < psVar4) {
    z->img_buffer = psVar5 + 1;
    sVar6 = *psVar5;
    psVar5 = psVar5 + 1;
  }
  else if (z->read_from_callbacks == 0) {
    sVar6 = '\0';
  }
  else {
    psVar5 = z->buffer_start;
    iVar3 = (*(z->io).read)(z->io_user_data,(char *)psVar5,z->buflen);
    if (iVar3 == 0) {
      z->read_from_callbacks = 0;
      psVar4 = z->buffer_start + 1;
      z->buffer_start[0] = '\0';
      sVar6 = '\0';
    }
    else {
      psVar4 = psVar5 + iVar3;
      sVar6 = *psVar5;
    }
    z->img_buffer_end = psVar4;
    psVar5 = z->buffer_start + 1;
    z->img_buffer = psVar5;
  }
  psVar1 = z->buffer_start;
  psVar2 = z->buffer_start + 1;
  lVar7 = 0;
  do {
    if ((z->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0011ac5e:
      bVar8 = psVar5 < psVar4;
    }
    else {
      iVar3 = (*(z->io).eof)(z->io_user_data);
      if (iVar3 != 0) {
        if (z->read_from_callbacks != 0) {
          psVar5 = z->img_buffer;
          psVar4 = z->img_buffer_end;
          goto LAB_0011ac5e;
        }
        goto LAB_0011adac;
      }
      bVar8 = true;
    }
    if ((sVar6 == '\n') || (!bVar8)) goto LAB_0011adac;
    buffer[lVar7] = sVar6;
    if (lVar7 == 0x3fe) break;
    psVar5 = z->img_buffer;
    psVar4 = z->img_buffer_end;
    if (psVar5 < psVar4) {
      z->img_buffer = psVar5 + 1;
      sVar6 = *psVar5;
      psVar5 = psVar5 + 1;
    }
    else if (z->read_from_callbacks == 0) {
      sVar6 = '\0';
    }
    else {
      iVar3 = (*(z->io).read)(z->io_user_data,(char *)psVar1,z->buflen);
      if (iVar3 == 0) {
        z->read_from_callbacks = 0;
        z->buffer_start[0] = '\0';
        sVar6 = '\0';
        psVar4 = psVar2;
      }
      else {
        sVar6 = *psVar1;
        psVar4 = psVar1 + iVar3;
      }
      z->img_buffer_end = psVar4;
      z->img_buffer = psVar2;
      psVar5 = psVar2;
    }
    lVar7 = lVar7 + 1;
  } while( true );
  do {
    if ((z->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0011ad1e:
      psVar4 = z->img_buffer;
      psVar5 = z->img_buffer_end;
      if (psVar5 <= psVar4) break;
    }
    else {
      iVar3 = (*(z->io).eof)(z->io_user_data);
      if (iVar3 != 0) {
        if (z->read_from_callbacks != 0) goto LAB_0011ad1e;
        break;
      }
      psVar4 = z->img_buffer;
      psVar5 = z->img_buffer_end;
    }
    if (psVar4 < psVar5) {
      z->img_buffer = psVar4 + 1;
      sVar6 = *psVar4;
    }
    else if (z->read_from_callbacks == 0) {
      sVar6 = '\0';
    }
    else {
      iVar3 = (*(z->io).read)(z->io_user_data,(char *)psVar1,z->buflen);
      if (iVar3 == 0) {
        z->read_from_callbacks = 0;
        z->buffer_start[0] = '\0';
        sVar6 = '\0';
        psVar4 = psVar2;
      }
      else {
        sVar6 = *psVar1;
        psVar4 = psVar1 + iVar3;
      }
      z->img_buffer_end = psVar4;
      z->img_buffer = psVar2;
    }
  } while (sVar6 != '\n');
  lVar7 = 0x3ff;
LAB_0011adac:
  buffer[lVar7] = '\0';
  return buffer;
}

Assistant:

static char *stbi__hdr_gettoken(stbi__context *z, char *buffer)
{
   int len=0;
   char c = '\0';

   c = (char) stbi__get8(z);

   while (!stbi__at_eof(z) && c != '\n') {
      buffer[len++] = c;
      if (len == STBI__HDR_BUFLEN-1) {
         // flush to end of line
         while (!stbi__at_eof(z) && stbi__get8(z) != '\n')
            ;
         break;
      }
      c = (char) stbi__get8(z);
   }

   buffer[len] = 0;
   return buffer;
}